

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O1

int raplcap_pd_is_zone_enabled(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  int iVar1;
  raplcap_msr *ctx;
  int *piVar2;
  off_t msr;
  uint uVar3;
  int en [2];
  uint64_t msrval;
  int local_40 [2];
  uint64_t local_38;
  
  local_40[0] = 1;
  local_40[1] = 1;
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    msr = ZONE_OFFSETS_PL[zone];
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    msr = -1;
  }
  uVar3 = 0xffffffff;
  if (-1 < msr && ctx != (raplcap_msr *)0x0) {
    iVar1 = msr_sys_read(ctx->sys,&local_38,pkg,die,msr);
    if (iVar1 == 0) {
      msr_is_zone_enabled(&ctx->ctx,zone,local_38,local_40,local_40 + 1);
      uVar3 = (uint)(local_40[1] != 0 && local_40[0] != 0);
      if (local_40[1] != 0 && local_40[0] != 0) {
        raplcap_msr_pd_is_zone_clamped(rc,pkg,0,zone);
      }
    }
  }
  return uVar3;
}

Assistant:

int raplcap_pd_is_zone_enabled(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  uint64_t msrval;
  int en[2] = { 1, 1 };
  int ret;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msr_is_zone_enabled(&state->ctx, zone, msrval, &en[0], &en[1]);
  ret = en[0] && en[1];
  if (ret && !raplcap_msr_is_zone_clamped(rc, pkg, zone)) {
    raplcap_log(INFO, "Zone is enabled but clamping is not\n");
  }
  raplcap_log(DEBUG, "raplcap_pd_is_zone_enabled: pkg=%"PRIu32", die=%"PRIu32", zone=%d, enabled=%d\n",
              pkg, die, zone, ret);
  return ret;
}